

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O3

ostream * ast::operator<<(ostream *out,Expr *obj)

{
  long *local_30;
  long local_28;
  long local_20 [2];
  
  (*(obj->super_Node)._vptr_Node[3])(&local_30);
  std::__ostream_insert<char,std::char_traits<char>>(out,(char *)local_30,local_28);
  if (local_30 != local_20) {
    operator_delete(local_30,local_20[0] + 1);
  }
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream &out, Expr const *obj)
    {
        out << obj->toString();
        return out;
    }